

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  undefined8 *puVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  TimeInMillis local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  bVar2 = UnitTestImpl::Passed(unit_test->impl_);
  pcVar9 = "0";
  pcVar8 = "";
  if (bVar2) {
    pcVar9 = "1";
    pcVar8 = "";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar9,pcVar8);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x144b58);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c0 = *puVar6;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar6;
    local_d0 = (ulong *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_50 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>(&local_b0,&local_50);
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < local_b0._M_string_length + local_c8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_c8 <= (ulong)uVar11) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0013dc21;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_0013dc21:
  local_f0 = &local_e0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar4[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar4;
  }
  local_e8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    SendLn("event=TestIterationEnd&passed=" +
           FormatBool(unit_test.Passed()) + "&elapsed_time=" +
           StreamableToString(unit_test.elapsed_time()) + "ms");
  }